

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_18f9de::CBSTest_ImplicitString_Test::TestBody(CBSTest_ImplicitString_Test *this)

{
  uint8_t *puVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  bool *lhs;
  ScopedTrace gtest_trace_862;
  AssertionResult gtest_ar;
  UniquePtr<uint8_t> scoper;
  uint8_t *storage;
  CBS in;
  CBS out;
  ScopedTrace local_99;
  internal local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  Bytes local_88;
  long local_78;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_70;
  _Head_base<0UL,_unsigned_char_*,_false> local_68;
  CBS local_60;
  Bytes local_50;
  CBS local_40;
  
  lhs = (bool *)&DAT_006f3280;
  local_78 = 0xf0;
  do {
    puVar1 = *(uint8_t **)(lhs + -0x10);
    sVar2 = *(size_t *)(lhs + -8);
    local_60.data = puVar1;
    local_60.len = sVar2;
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_99,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x35e,(Bytes *)&local_60);
    local_68._M_head_impl = (uchar *)0x0;
    local_60.data = puVar1;
    local_60.len = sVar2;
    iVar4 = CBS_get_asn1_implicit_string(&local_60,&local_40,&local_68._M_head_impl,0x80000000,4);
    local_70._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)local_68._M_head_impl;
    local_88.span_.data_ = (uchar *)CONCAT71(local_88.span_.data_._1_7_,iVar4 != 0);
    testing::internal::CmpHelperEQ<bool,bool>
              (local_98,"test.ok","static_cast<bool>(ok)",lhs,(bool *)&local_88);
    if (local_98[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      pcVar5 = "";
      if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = (local_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x366,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
      if ((long *)local_88.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_88.span_.data_ + 8))();
      }
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    if (iVar4 != 0) {
      local_88.span_.data_ = *(uchar **)(lhs + 8);
      local_88.span_.size_ = *(size_t *)(lhs + 0x10);
      local_50.span_.data_ = local_40.data;
      local_50.span_.size_ = local_40.len;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                (local_98,"Bytes(test.out, test.out_len)","Bytes(CBS_data(&out), CBS_len(&out))",
                 &local_88,&local_50);
      if (local_98[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_88);
        pcVar5 = "";
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_90->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x36a,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
        if ((long *)local_88.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_88.span_.data_ + 8))();
        }
      }
      if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_90,local_90);
      }
    }
    lVar3 = local_78;
    std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_70);
    testing::ScopedTrace::~ScopedTrace(&local_99);
    lhs = lhs + 0x28;
    local_78 = lVar3 + -0x28;
  } while (local_78 != 0);
  return;
}

Assistant:

TEST(CBSTest, ImplicitString) {
  for (const auto &test : kImplicitStringTests) {
    SCOPED_TRACE(Bytes(test.in, test.in_len));
    uint8_t *storage = nullptr;
    CBS in, out;
    CBS_init(&in, reinterpret_cast<const uint8_t *>(test.in), test.in_len);
    int ok = CBS_get_asn1_implicit_string(&in, &out, &storage,
                                          CBS_ASN1_CONTEXT_SPECIFIC | 0,
                                          CBS_ASN1_OCTETSTRING);
    bssl::UniquePtr<uint8_t> scoper(storage);
    EXPECT_EQ(test.ok, static_cast<bool>(ok));

    if (ok) {
      EXPECT_EQ(Bytes(test.out, test.out_len),
                Bytes(CBS_data(&out), CBS_len(&out)));
    }
  }
}